

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcDataStream * CTcSymObjBase::get_stream_from_meta(tc_metaclass_t meta)

{
  tc_metaclass_t meta_local;
  undefined8 local_8;
  
  if (meta == TC_META_TADSOBJ) {
    local_8 = G_os;
  }
  else if (meta == TC_META_ICMOD) {
    local_8 = G_icmod_stream;
  }
  else {
    local_8 = (CTcDataStream *)0x0;
  }
  return local_8;
}

Assistant:

CTcDataStream *CTcSymObjBase::get_stream_from_meta(tc_metaclass_t meta)
{
    switch(meta)
    {
    case TC_META_TADSOBJ:
        /* it's the regular object stream */
        return G_os;

    case TC_META_ICMOD:
        /* intrinsic class modifier stream */
        return G_icmod_stream;

    default:
        /* other metaclasses have no stream */
        return 0;
    }
}